

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O1

string * __thiscall
setup::filename_map::lookup(string *__return_storage_ptr__,filename_map *this,string *key)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  const_iterator cVar6;
  char cVar7;
  size_type sVar8;
  size_type sVar9;
  
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)cVar6._M_node ==
      &(this->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    sVar8 = key->_M_string_length;
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sVar8);
    sVar2 = key->_M_string_length;
    if (sVar2 != 0) {
      pcVar3 = (key->_M_dataplus)._M_p;
      pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar9 = 0;
      do {
        cVar1 = pcVar3[sVar9];
        bVar5 = anon_unknown_0::is_unsafe_path_char::operator()
                          ((is_unsafe_path_char *)(ulong)(uint)(int)cVar1,(char)sVar8);
        cVar7 = '$';
        if (!bVar5) {
          cVar7 = cVar1;
        }
        pcVar4[sVar9] = cVar7;
        sVar9 = sVar9 + 1;
      } while (sVar2 != sVar9);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename_map::lookup(const std::string & key) const {
	std::map<std::string, std::string>::const_iterator i = find(key);
	return (i == end()) ? replace_unsafe_chars(key) : i->second;
}